

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
       *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *val,bool pretty_print,bool ensure_ascii,uint indent_step,uint current_indent)

{
  _func_int **pp_Var1;
  pointer pbVar2;
  ulong uVar3;
  _Rb_tree_node_base *p_Var4;
  undefined1 *puVar5;
  pointer pbVar6;
  _Base_ptr p_Var7;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  undefined8 uVar8;
  char *pcVar9;
  pointer pbVar10;
  element_type *peVar11;
  uint uVar12;
  ulong uVar13;
  object_t *poVar14;
  _Rb_tree_header *p_Var15;
  
  switch(val->m_type) {
  case null:
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar11->_vptr_output_adapter_protocol[1];
    pcVar9 = "null";
    break;
  case object:
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pp_Var1 = peVar11->_vptr_output_adapter_protocol;
    if ((((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
      if (pretty_print) {
        (*pp_Var1[1])(peVar11,"{\n",2);
        uVar12 = current_indent + indent_step;
        uVar3 = (ulong)uVar12;
        uVar13 = (this->indent_string)._M_string_length;
        if (uVar13 < uVar3) {
          std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar13 * '\x02');
        }
        poVar14 = (val->m_value).object;
        p_Var4 = (poVar14->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((poVar14->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1) {
          uVar13 = 0;
          do {
            peVar11 = (this->o).
                      super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (*peVar11->_vptr_output_adapter_protocol[1])
                      (peVar11,(this->indent_string)._M_dataplus._M_p,uVar3);
            peVar11 = (this->o).
                      super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (**peVar11->_vptr_output_adapter_protocol)(peVar11,0x22);
            dump_escaped(this,(string_t *)(p_Var4 + 1),ensure_ascii);
            peVar11 = (this->o).
                      super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,"\": ",3);
            dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)(p_Var4 + 2),true,ensure_ascii,indent_step,uVar12);
            peVar11 = (this->o).
                      super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,",\n",2);
            uVar13 = uVar13 + 1;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
            poVar14 = (val->m_value).object;
          } while (uVar13 < (poVar14->_M_t)._M_impl.super__Rb_tree_header._M_node_count - 1);
        }
        p_Var15 = &(poVar14->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var4 == p_Var15) {
          __assert_fail("i != val.m_value.object->cend()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/login/./nlohmann/json.hpp"
                        ,0x3634,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        puVar5 = (undefined1 *)std::_Rb_tree_increment(p_Var4);
        if ((_Rb_tree_header *)puVar5 != p_Var15) {
          __assert_fail("std::next(i) == val.m_value.object->cend()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/login/./nlohmann/json.hpp"
                        ,0x3635,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_output_adapter_protocol[1])
                  (peVar11,(this->indent_string)._M_dataplus._M_p,uVar3);
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar11->_vptr_output_adapter_protocol)(peVar11,0x22);
        dump_escaped(this,(string_t *)(p_Var4 + 1),ensure_ascii);
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,"\": ",3);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)(p_Var4 + 2),true,ensure_ascii,indent_step,uVar12);
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar11->_vptr_output_adapter_protocol)(peVar11,10);
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_output_adapter_protocol[1])
                  (peVar11,(this->indent_string)._M_dataplus._M_p,current_indent);
      }
      else {
        (**pp_Var1)(peVar11,0x7b);
        poVar14 = (val->m_value).object;
        p_Var7 = (poVar14->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((poVar14->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1) {
          uVar13 = 0;
          do {
            peVar11 = (this->o).
                      super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (**peVar11->_vptr_output_adapter_protocol)(peVar11,0x22);
            dump_escaped(this,(string_t *)(p_Var7 + 1),ensure_ascii);
            peVar11 = (this->o).
                      super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,"\":",2);
            dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)(p_Var7 + 2),false,ensure_ascii,indent_step,current_indent);
            peVar11 = (this->o).
                      super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (**peVar11->_vptr_output_adapter_protocol)(peVar11,0x2c);
            uVar13 = uVar13 + 1;
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
            poVar14 = (val->m_value).object;
          } while (uVar13 < (poVar14->_M_t)._M_impl.super__Rb_tree_header._M_node_count - 1);
        }
        p_Var15 = &(poVar14->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var7 == p_Var15) {
          __assert_fail("i != val.m_value.object->cend()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/login/./nlohmann/json.hpp"
                        ,0x3650,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        puVar5 = (undefined1 *)std::_Rb_tree_increment(p_Var7);
        if ((_Rb_tree_header *)puVar5 != p_Var15) {
          __assert_fail("std::next(i) == val.m_value.object->cend()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/login/./nlohmann/json.hpp"
                        ,0x3651,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar11->_vptr_output_adapter_protocol)(peVar11,0x22);
        dump_escaped(this,(string_t *)(p_Var7 + 1),ensure_ascii);
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,"\":",2);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)(p_Var7 + 2),false,ensure_ascii,indent_step,current_indent);
      }
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = *peVar11->_vptr_output_adapter_protocol;
      uVar8 = 0x7d;
      goto LAB_0012b875;
    }
    UNRECOVERED_JUMPTABLE_00 = pp_Var1[1];
    pcVar9 = "{}";
    goto LAB_0012b6b1;
  case array:
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pp_Var1 = peVar11->_vptr_output_adapter_protocol;
    if ((((val->m_value).array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (((val->m_value).array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      if (pretty_print) {
        (*pp_Var1[1])(peVar11,"[\n",2);
        uVar12 = indent_step + current_indent;
        uVar3 = (ulong)uVar12;
        uVar13 = (this->indent_string)._M_string_length;
        if (uVar13 < uVar3) {
          std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar13 * '\x02');
        }
        pbVar10 = (((val->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar2 = (((val->m_value).array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar10 != pbVar2 + -1) {
          do {
            peVar11 = (this->o).
                      super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (*peVar11->_vptr_output_adapter_protocol[1])
                      (peVar11,(this->indent_string)._M_dataplus._M_p,uVar3);
            dump(this,pbVar10,true,ensure_ascii,indent_step,uVar12);
            peVar11 = (this->o).
                      super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,",\n",2);
            pbVar10 = pbVar10 + 1;
            pbVar2 = (((val->m_value).array)->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          } while (pbVar10 != pbVar2 + -1);
          pbVar10 = (((val->m_value).array)->
                    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        if (pbVar10 == pbVar2) {
          __assert_fail("not val.m_value.array->empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/login/./nlohmann/json.hpp"
                        ,0x367a,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_output_adapter_protocol[1])
                  (peVar11,(this->indent_string)._M_dataplus._M_p,uVar3);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)(((val->m_value).string)->_M_string_length - 0x10),true,ensure_ascii,
             indent_step,uVar12);
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar11->_vptr_output_adapter_protocol)(peVar11,10);
        peVar11 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_output_adapter_protocol[1])
                  (peVar11,(this->indent_string)._M_dataplus._M_p,current_indent);
      }
      else {
        (**pp_Var1)(peVar11,0x5b);
        pbVar2 = (((val->m_value).array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar6 = (((val->m_value).array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pbVar10 = pbVar6 + -1;
        if (pbVar2 != pbVar10) {
          do {
            dump(this,pbVar2,false,ensure_ascii,indent_step,current_indent);
            peVar11 = (this->o).
                      super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (**peVar11->_vptr_output_adapter_protocol)(peVar11,0x2c);
            pbVar2 = pbVar2 + 1;
            pbVar6 = (((val->m_value).array)->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            pbVar10 = pbVar6 + -1;
          } while (pbVar2 != pbVar10);
          pbVar2 = (((val->m_value).array)->
                   super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        }
        if (pbVar2 == pbVar6) {
          __assert_fail("not val.m_value.array->empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/login/./nlohmann/json.hpp"
                        ,0x368f,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        dump(this,pbVar10,false,ensure_ascii,indent_step,current_indent);
      }
      peVar11 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = *peVar11->_vptr_output_adapter_protocol;
      uVar8 = 0x5d;
      goto LAB_0012b875;
    }
    UNRECOVERED_JUMPTABLE_00 = pp_Var1[1];
    pcVar9 = "[]";
LAB_0012b6b1:
    uVar8 = 2;
    goto LAB_0012b6b6;
  case string:
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (**peVar11->_vptr_output_adapter_protocol)(peVar11,0x22);
    dump_escaped(this,(string_t *)(val->m_value).object,ensure_ascii);
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = *peVar11->_vptr_output_adapter_protocol;
    uVar8 = 0x22;
LAB_0012b875:
    (*UNRECOVERED_JUMPTABLE_00)(peVar11,uVar8);
    return;
  case boolean:
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar11->_vptr_output_adapter_protocol[1];
    if ((val->m_value).boolean != true) {
      pcVar9 = "false";
      uVar8 = 5;
      goto LAB_0012b6b6;
    }
    pcVar9 = "true";
    break;
  case number_integer:
    dump_integer<long,_0>(this,(val->m_value).number_integer);
    return;
  case number_unsigned:
    dump_integer<unsigned_long,_0>(this,(val->m_value).number_unsigned);
    return;
  case number_float:
    dump_float(this,(val->m_value).number_float);
    return;
  case discarded:
    peVar11 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar11->_vptr_output_adapter_protocol[1];
    pcVar9 = "<discarded>";
    uVar8 = 0xb;
    goto LAB_0012b6b6;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/login/./nlohmann/json.hpp"
                  ,0x36cc,
                  "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  uVar8 = 4;
LAB_0012b6b6:
  (*UNRECOVERED_JUMPTABLE_00)(peVar11,pcVar9,uVar8);
  return;
}

Assistant:

void dump(const BasicJsonType& val, const bool pretty_print,
              const bool ensure_ascii,
              const unsigned int indent_step,
              const unsigned int current_indent = 0)
    {
        switch (val.m_type)
        {
            case value_t::object:
            {
                if (val.m_value.object->empty())
                {
                    o->write_characters("{}", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    auto i = val.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\": ", 3);
                        dump(i->second, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    assert(i != val.m_value.object->cend());
                    assert(std::next(i) == val.m_value.object->cend());
                    o->write_characters(indent_string.c_str(), new_indent);
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\": ", 3);
                    dump(i->second, true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_character('{');

                    // first n-1 elements
                    auto i = val.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\":", 2);
                        dump(i->second, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    assert(i != val.m_value.object->cend());
                    assert(std::next(i) == val.m_value.object->cend());
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\":", 2);
                    dump(i->second, false, ensure_ascii, indent_step, current_indent);

                    o->write_character('}');
                }

                return;
            }

            case value_t::array:
            {
                if (val.m_value.array->empty())
                {
                    o->write_characters("[]", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("[\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    for (auto i = val.m_value.array->cbegin();
                            i != val.m_value.array->cend() - 1; ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        dump(*i, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    assert(not val.m_value.array->empty());
                    o->write_characters(indent_string.c_str(), new_indent);
                    dump(val.m_value.array->back(), true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character(']');
                }
                else
                {
                    o->write_character('[');

                    // first n-1 elements
                    for (auto i = val.m_value.array->cbegin();
                            i != val.m_value.array->cend() - 1; ++i)
                    {
                        dump(*i, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    assert(not val.m_value.array->empty());
                    dump(val.m_value.array->back(), false, ensure_ascii, indent_step, current_indent);

                    o->write_character(']');
                }

                return;
            }

            case value_t::string:
            {
                o->write_character('\"');
                dump_escaped(*val.m_value.string, ensure_ascii);
                o->write_character('\"');
                return;
            }

            case value_t::boolean:
            {
                if (val.m_value.boolean)
                {
                    o->write_characters("true", 4);
                }
                else
                {
                    o->write_characters("false", 5);
                }
                return;
            }

            case value_t::number_integer:
            {
                dump_integer(val.m_value.number_integer);
                return;
            }

            case value_t::number_unsigned:
            {
                dump_integer(val.m_value.number_unsigned);
                return;
            }

            case value_t::number_float:
            {
                dump_float(val.m_value.number_float);
                return;
            }

            case value_t::discarded:
            {
                o->write_characters("<discarded>", 11);
                return;
            }

            case value_t::null:
            {
                o->write_characters("null", 4);
                return;
            }

            default:            // LCOV_EXCL_LINE
                assert(false);  // LCOV_EXCL_LINE
        }
    }